

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

int instadisintegrate(char *str)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (u.uprops[4].intrinsic == 0 && u.uprops[4].extrinsic == 0) {
    if (((byte)youmonst.mintrinsics & 8) != 0) {
      return 0;
    }
  }
  else {
    if ((u.uprops[4].intrinsic >> 0x1a & 1) == 0) {
      return 0;
    }
    if ((u.uprops[4].intrinsic & 0xfbffffff) != 0 || u.uprops[4].extrinsic != 0) {
      return 0;
    }
    if (((byte)youmonst.mintrinsics & 8) != 0) {
      return 0;
    }
    uVar1 = mt_random();
    if (0x19999999 < (uVar1 * -0x33333333 >> 1 | (uint)((uVar1 * -0x33333333 & 1) != 0) << 0x1f)) {
      return 0;
    }
  }
  uVar1 = mt_random();
  if ((uVar1 * -0x33333333 >> 1 | (uint)((uVar1 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a) {
    return 0;
  }
  pline("You disintegrate!");
  uVar1 = 1;
  if (100 < (youmonst.data)->cwt) {
    uVar1 = ((youmonst.data)->cwt >> 2) / 0x19;
  }
  uVar2 = mt_random();
  uVar3 = 5;
  if (uVar2 % uVar1 < 5) {
    uVar3 = uVar2 % uVar1;
  }
  killer_format = 1;
  u.ugrave_arise = -3;
  killer = str;
  done(0xb);
  return uVar3 + 1;
}

Assistant:

int instadisintegrate(const char *str)
{
	int result;
	if (FDisint_resistance || (PDisint_resistance && rn2(10)) || !rn2(10))
	    return 0;
	pline("You disintegrate!");
	result = youmonst.data->cwt;
	weight_dmg(result);
	result = min(6, result);
	killer_format = KILLED_BY;
	killer = str;
	u.ugrave_arise = -3;
	done(DISINTEGRATED);

	return result;
}